

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk.c
# Opt level: O0

void hd_drop_dest_disk(hd_context *ctx,hd_disk_dest *disk)

{
  int iVar1;
  hd_disk_dest *disk_local;
  hd_context *ctx_local;
  
  iVar1 = hd_drop_imp(ctx,disk,&disk->refs);
  if (iVar1 != 0) {
    if (-1 < disk->dev_fd) {
      close(disk->dev_fd);
      disk->dev_fd = 0;
    }
    hd_free(ctx,disk);
  }
  return;
}

Assistant:

void
hd_drop_dest_disk(hd_context *ctx, hd_disk_dest *disk)
{
    if (hd_drop_imp(ctx, disk, &disk->refs))
    {
        SAFE_DEV_CLOSE(disk->dev_fd);
        hd_free(ctx, disk);
    }
}